

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O1

int compression_code_ppmd(archive *a,la_zstream *lastrm,la_zaction action)

{
  uint8_t uVar1;
  int *piVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  undefined8 uVar5;
  bool bVar6;
  size_t sVar7;
  
  piVar2 = (int *)lastrm->real_stream;
  if (*(long *)(piVar2 + 0x12d0) != 0) {
    if (lastrm->avail_out != 0) {
      puVar4 = (uint8_t *)(*(long *)(piVar2 + 0x12cc) - *(long *)(piVar2 + 0x12d0));
      do {
        if (*(long *)(piVar2 + 0x12d0) == 0) break;
        uVar1 = *puVar4;
        puVar3 = lastrm->next_out;
        lastrm->next_out = puVar3 + 1;
        *puVar3 = uVar1;
        lastrm->avail_out = lastrm->avail_out - 1;
        lastrm->total_out = lastrm->total_out + 1;
        *(long *)(piVar2 + 0x12d0) = *(long *)(piVar2 + 0x12d0) + -1;
        puVar4 = puVar4 + 1;
      } while (lastrm->avail_out != 0);
    }
    uVar5 = 0;
    bVar6 = false;
    if (*(long *)(piVar2 + 0x12d0) == 0) {
      if (*piVar2 == 1) {
        uVar5 = 1;
        bVar6 = false;
      }
      else {
        uVar5 = *(undefined8 *)(piVar2 + 0x12ca);
        *(undefined8 *)(piVar2 + 0x12cc) = uVar5;
        bVar6 = true;
      }
    }
    if (!bVar6) {
      return (int)uVar5;
    }
  }
  bVar6 = lastrm->avail_in == 0;
  if ((!bVar6) && (lastrm->avail_out != 0)) {
    do {
      puVar4 = lastrm->next_in;
      lastrm->next_in = puVar4 + 1;
      Ppmd7_EncodeSymbol((CPpmd7 *)(piVar2 + 2),(CPpmd7z_RangeEnc *)(piVar2 + 0x12be),(int)*puVar4);
      sVar7 = lastrm->avail_in - 1;
      lastrm->avail_in = sVar7;
      lastrm->total_in = lastrm->total_in + 1;
      bVar6 = sVar7 == 0;
      if (bVar6) break;
    } while (lastrm->avail_out != 0);
  }
  if ((action == ARCHIVE_Z_FINISH) && (bVar6)) {
    Ppmd7z_RangeEnc_FlushData((CPpmd7z_RangeEnc *)(piVar2 + 0x12be));
    *piVar2 = 1;
    if (*(long *)(piVar2 + 0x12d0) == 0) {
      return 1;
    }
  }
  return 0;
}

Assistant:

static int
compression_code_ppmd(struct archive *a,
    struct la_zstream *lastrm, enum la_zaction action)
{
	struct ppmd_stream *strm;

	(void)a; /* UNUSED */

	strm = (struct ppmd_stream *)lastrm->real_stream;

	/* Copy encoded data if there are remaining bytes from previous call. */
	if (strm->buff_bytes) {
		uint8_t *p = strm->buff_ptr - strm->buff_bytes;
		while (lastrm->avail_out && strm->buff_bytes) {
			*lastrm->next_out++ = *p++;
			lastrm->avail_out--;
			lastrm->total_out++;
			strm->buff_bytes--;
		}
		if (strm->buff_bytes)
			return (ARCHIVE_OK);
		if (strm->stat == 1)
			return (ARCHIVE_EOF);
		strm->buff_ptr = strm->buff;
	}
	while (lastrm->avail_in && lastrm->avail_out) {
		__archive_ppmd7_functions.Ppmd7_EncodeSymbol(
			&(strm->ppmd7_context), &(strm->range_enc),
			*lastrm->next_in++);
		lastrm->avail_in--;
		lastrm->total_in++;
	}
	if (lastrm->avail_in == 0 && action == ARCHIVE_Z_FINISH) {
		__archive_ppmd7_functions.Ppmd7z_RangeEnc_FlushData(
			&(strm->range_enc));
		strm->stat = 1;
		/* Return EOF if there are no remaining bytes. */
		if (strm->buff_bytes == 0)
			return (ARCHIVE_EOF);
	}
	return (ARCHIVE_OK);
}